

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall
Assimp::ValidateDSProcess::SearchForInvalidTextures
          (ValidateDSProcess *this,aiMaterial *pMaterial,aiTextureType type)

{
  value_type vVar1;
  aiMaterialProperty *paVar2;
  aiMesh *paVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint *puVar7;
  size_type __n;
  reference pvVar8;
  aiMesh *mesh_1;
  uint a_1;
  int iChannels;
  aiMesh *mesh;
  uint a;
  aiMaterialProperty *prop_1;
  uint i_1;
  bool bNoSpecified;
  allocator<aiTextureMapping> local_61;
  undefined1 local_60 [8];
  vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> mappings;
  aiMaterialProperty *prop;
  uint local_30;
  uint i;
  int iIndex;
  int iNumIndices;
  char *szType;
  aiMaterial *paStack_18;
  aiTextureType type_local;
  aiMaterial *pMaterial_local;
  ValidateDSProcess *this_local;
  
  szType._4_4_ = type;
  paStack_18 = pMaterial;
  pMaterial_local = (aiMaterial *)this;
  _iIndex = TextureTypeToString(type);
  i = 0;
  local_30 = 0xffffffff;
  for (prop._4_4_ = 0; prop._4_4_ < paStack_18->mNumProperties; prop._4_4_ = prop._4_4_ + 1) {
    paVar2 = paStack_18->mProperties[prop._4_4_];
    if (paVar2 == (aiMaterialProperty *)0x0) {
      __assert_fail("nullptr != prop",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ValidateDataStructure.cpp"
                    ,0x243,
                    "void Assimp::ValidateDSProcess::SearchForInvalidTextures(const aiMaterial *, aiTextureType)"
                   );
    }
    iVar6 = strcmp((paVar2->mKey).data,"$tex.file");
    if ((iVar6 == 0) && (paVar2->mSemantic == szType._4_4_)) {
      mappings.super__Vector_base<aiTextureMapping,_std::allocator<aiTextureMapping>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = paVar2->mIndex;
      puVar7 = (uint *)std::max<int>((int *)&local_30,
                                     (int *)((long)&mappings.
                                                  super__Vector_base<aiTextureMapping,_std::allocator<aiTextureMapping>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4));
      local_30 = *puVar7;
      i = i + 1;
      if (paVar2->mType != aiPTI_String) {
        ReportError(this,"Material property %s is expected to be a string",(paVar2->mKey).data);
      }
    }
  }
  if (local_30 + 1 == i) {
    if (i != 0) {
      __n = (size_type)(int)i;
      std::allocator<aiTextureMapping>::allocator(&local_61);
      std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::vector
                ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)local_60,__n,
                 &local_61);
      std::allocator<aiTextureMapping>::~allocator(&local_61);
      bVar4 = true;
      for (prop_1._4_4_ = 0; prop_1._4_4_ < paStack_18->mNumProperties;
          prop_1._4_4_ = prop_1._4_4_ + 1) {
        paVar2 = paStack_18->mProperties[prop_1._4_4_];
        if (paVar2->mSemantic == szType._4_4_) {
          if ((int)i <= (int)paVar2->mIndex) {
            ReportError(this,
                        "Found texture property with index %i, although there are only %i textures of type %s"
                        ,(ulong)paVar2->mIndex,(ulong)i,_iIndex);
          }
          iVar6 = strcmp((paVar2->mKey).data,"$tex.mapping");
          if (iVar6 == 0) {
            if ((paVar2->mType != aiPTI_Integer) || (paVar2->mDataLength < 4)) {
              ReportError(this,"Material property %s%i is expected to be an integer (size is %i)",
                          (paVar2->mKey).data,(ulong)paVar2->mIndex,(ulong)paVar2->mDataLength);
            }
            vVar1 = *(value_type *)paVar2->mData;
            pvVar8 = std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::operator[]
                               ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)
                                local_60,(ulong)paVar2->mIndex);
            *pvVar8 = vVar1;
          }
          else {
            iVar6 = strcmp((paVar2->mKey).data,"$tex.uvtrafo");
            if (iVar6 == 0) {
              if ((paVar2->mType != aiPTI_Float) || (paVar2->mDataLength < 0x14)) {
                ReportError(this,
                            "Material property %s%i is expected to be 5 floats large (size is %i)",
                            (paVar2->mKey).data,(ulong)paVar2->mIndex,(ulong)paVar2->mDataLength);
              }
              vVar1 = *(value_type *)paVar2->mData;
              pvVar8 = std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::operator[]
                                 ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)
                                  local_60,(ulong)paVar2->mIndex);
              *pvVar8 = vVar1;
            }
            else {
              iVar6 = strcmp((paVar2->mKey).data,"$tex.uvwsrc");
              if (iVar6 == 0) {
                if ((paVar2->mType != aiPTI_Integer) || (paVar2->mDataLength < 4)) {
                  ReportError(this,
                              "Material property %s%i is expected to be an integer (size is %i)",
                              (paVar2->mKey).data,(ulong)paVar2->mIndex,(ulong)paVar2->mDataLength);
                }
                bVar4 = false;
                local_30 = *(uint *)paVar2->mData;
                for (mesh._4_4_ = 0; mesh._4_4_ < this->mScene->mNumMeshes;
                    mesh._4_4_ = mesh._4_4_ + 1) {
                  paVar3 = this->mScene->mMeshes[mesh._4_4_];
                  if (paVar3->mMaterialIndex == prop_1._4_4_) {
                    mesh_1._4_4_ = 0;
                    while (bVar5 = aiMesh::HasTextureCoords(paVar3,mesh_1._4_4_), bVar5) {
                      mesh_1._4_4_ = mesh_1._4_4_ + 1;
                    }
                    if ((int)mesh_1._4_4_ <= (int)local_30) {
                      ReportWarning(this,
                                    "Invalid UV index: %i (key %s). Mesh %i has only %i UV channels"
                                    ,(ulong)local_30,(paVar2->mKey).data,(ulong)mesh._4_4_,
                                    (ulong)mesh_1._4_4_);
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (bVar4) {
        for (mesh_1._0_4_ = 0; (uint)mesh_1 < this->mScene->mNumMeshes;
            mesh_1._0_4_ = (uint)mesh_1 + 1) {
          paVar3 = this->mScene->mMeshes[(uint)mesh_1];
          if (((paVar3->mMaterialIndex == local_30) &&
              (pvVar8 = std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::operator[]
                                  ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)
                                   local_60,0), *pvVar8 == aiTextureMapping_UV)) &&
             (paVar3->mTextureCoords[0] == (aiVector3D *)0x0)) {
            ReportWarning(this,"UV-mapped texture, but there are no UV coords");
          }
        }
      }
      std::vector<aiTextureMapping,_std::allocator<aiTextureMapping>_>::~vector
                ((vector<aiTextureMapping,_std::allocator<aiTextureMapping>_> *)local_60);
    }
    return;
  }
  ReportError(this,"%s #%i is set, but there are only %i %s textures",_iIndex,(ulong)local_30,
              (ulong)i,_iIndex);
}

Assistant:

void ValidateDSProcess::SearchForInvalidTextures(const aiMaterial* pMaterial,
    aiTextureType type)
{
    const char* szType = TextureTypeToString(type);

    // ****************************************************************************
    // Search all keys of the material ...
    // textures must be specified with ascending indices
    // (e.g. diffuse #2 may not be specified if diffuse #1 is not there ...)
    // ****************************************************************************

    int iNumIndices = 0;
    int iIndex = -1;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i) {
        aiMaterialProperty* prop = pMaterial->mProperties[ i ];
        ai_assert(nullptr != prop);
        if ( !::strcmp(prop->mKey.data,"$tex.file") && prop->mSemantic == static_cast<unsigned int>(type))  {
            iIndex = std::max(iIndex, (int) prop->mIndex);
            ++iNumIndices;

            if (aiPTI_String != prop->mType) {
                ReportError("Material property %s is expected to be a string", prop->mKey.data);
            }
        }
    }
    if (iIndex +1 != iNumIndices)   {
        ReportError("%s #%i is set, but there are only %i %s textures",
            szType,iIndex,iNumIndices,szType);
    }
    if (!iNumIndices)return;
    std::vector<aiTextureMapping> mappings(iNumIndices);

    // Now check whether all UV indices are valid ...
    bool bNoSpecified = true;
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i)
    {
        aiMaterialProperty* prop = pMaterial->mProperties[i];
        if (prop->mSemantic != type)continue;

        if ((int)prop->mIndex >= iNumIndices)
        {
            ReportError("Found texture property with index %i, although there "
                "are only %i textures of type %s",
                prop->mIndex, iNumIndices, szType);
        }

        if (!::strcmp(prop->mKey.data,"$tex.mapping"))  {
            if (aiPTI_Integer != prop->mType || prop->mDataLength < sizeof(aiTextureMapping))
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            mappings[prop->mIndex] = *((aiTextureMapping*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvtrafo")) {
            if (aiPTI_Float != prop->mType || prop->mDataLength < sizeof(aiUVTransform))
            {
                ReportError("Material property %s%i is expected to be 5 floats large (size is %i)",
                    prop->mKey.data,prop->mIndex, prop->mDataLength);
            }
            mappings[prop->mIndex] = *((aiTextureMapping*)prop->mData);
        }
        else if (!::strcmp(prop->mKey.data,"$tex.uvwsrc")) {
            if (aiPTI_Integer != prop->mType || sizeof(int) > prop->mDataLength)
            {
                ReportError("Material property %s%i is expected to be an integer (size is %i)",
                    prop->mKey.data,prop->mIndex,prop->mDataLength);
            }
            bNoSpecified = false;

            // Ignore UV indices for texture channels that are not there ...

            // Get the value
            iIndex = *((unsigned int*)prop->mData);

            // Check whether there is a mesh using this material
            // which has not enough UV channels ...
            for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
            {
                aiMesh* mesh = this->mScene->mMeshes[a];
                if(mesh->mMaterialIndex == (unsigned int)i)
                {
                    int iChannels = 0;
                    while (mesh->HasTextureCoords(iChannels))++iChannels;
                    if (iIndex >= iChannels)
                    {
                        ReportWarning("Invalid UV index: %i (key %s). Mesh %i has only %i UV channels",
                            iIndex,prop->mKey.data,a,iChannels);
                    }
                }
            }
        }
    }
    if (bNoSpecified)
    {
        // Assume that all textures are using the first UV channel
        for (unsigned int a = 0; a < mScene->mNumMeshes;++a)
        {
            aiMesh* mesh = mScene->mMeshes[a];
            if(mesh->mMaterialIndex == (unsigned int)iIndex && mappings[0] == aiTextureMapping_UV)
            {
                if (!mesh->mTextureCoords[0])
                {
                    // This is a special case ... it could be that the
                    // original mesh format intended the use of a special
                    // mapping here.
                    ReportWarning("UV-mapped texture, but there are no UV coords");
                }
            }
        }
    }
}